

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O1

void history_def_clear(void *p,HistEvent_conflict *ev)

{
  HistEvent_conflict *ev_00;
  hentry_t_conflict *in_RDX;
  hentry_t_conflict *extraout_RDX;
  
  ev_00 = *(HistEvent_conflict **)((long)p + 0x20);
  while (ev_00 != (HistEvent_conflict *)p) {
    history_def_delete((history_t *)p,ev_00,in_RDX);
    in_RDX = extraout_RDX;
    ev_00 = *(HistEvent_conflict **)((long)p + 0x20);
  }
  *(void **)((long)p + 0x28) = p;
  *(undefined8 *)((long)p + 0x34) = 0;
  return;
}

Assistant:

static void
history_def_clear(void *p, TYPE(HistEvent) *ev)
{
	history_t *h = (history_t *) p;

	while (h->list.prev != &h->list)
		history_def_delete(h, ev, h->list.prev);
	h->cursor = &h->list;
	h->eventid = 0;
	h->cur = 0;
}